

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *atlas)

{
  uchar *puVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  float fVar5;
  ImFontAtlasCustomRect *this;
  ImVec4 *pIVar6;
  uint uVar7;
  ImVec2 IVar8;
  ImVec4 local_90;
  float local_80;
  float half_v;
  ImVec2 local_74;
  ImVec2 uv1;
  float local_64;
  float fStack_60;
  ImVec2 uv0;
  uint i_5;
  uint i_4;
  uint i_3;
  uint *write_ptr_1;
  uint local_40;
  uint i_2;
  uint i_1;
  uint i;
  uchar *write_ptr;
  uint pad_right;
  uint pad_left;
  uint line_width;
  uint y;
  uint n;
  ImFontAtlasCustomRect *r;
  ImFontAtlas *atlas_local;
  
  if ((atlas->Flags & 4U) == 0) {
    this = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    bVar3 = ImFontAtlasCustomRect::IsPacked(this);
    if (!bVar3) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                    ,0xa99,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    for (line_width = 0; line_width < 0x40; line_width = line_width + 1) {
      uVar4 = this->Width - line_width >> 1;
      fVar5 = (float)((uint)this->Width - (uVar4 + line_width));
      bVar3 = false;
      if (uVar4 + line_width + (int)fVar5 == (uint)this->Width) {
        bVar3 = line_width < this->Height;
      }
      if (!bVar3) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                      ,0xaa3,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
        puVar2 = atlas->TexPixelsRGBA32;
        uVar7 = (uint)this->X + (this->Y + line_width) * atlas->TexWidth;
        for (i_5 = 0; i_5 < uVar4; i_5 = i_5 + 1) {
          puVar2[(ulong)uVar7 + (ulong)i_5] = 0;
        }
        for (uv0.y = 0.0; (uint)uv0.y < line_width; uv0.y = (float)((int)uv0.y + 1)) {
          puVar2[(ulong)uVar7 + (ulong)uVar4 + (ulong)(uint)uv0.y] = 0xffffffff;
        }
        for (uv0.x = 0.0; (uint)uv0.x < (uint)fVar5; uv0.x = (float)((int)uv0.x + 1)) {
          puVar2[(ulong)uVar7 + (ulong)uVar4 + (ulong)line_width + (ulong)(uint)uv0.x] = 0;
        }
      }
      else {
        puVar1 = atlas->TexPixelsAlpha8;
        uVar7 = (uint)this->X + (this->Y + line_width) * atlas->TexWidth;
        for (i_2 = 0; i_2 < uVar4; i_2 = i_2 + 1) {
          puVar1[(ulong)i_2 + (ulong)uVar7] = '\0';
        }
        for (local_40 = 0; local_40 < line_width; local_40 = local_40 + 1) {
          puVar1[(ulong)local_40 + (ulong)uVar4 + (ulong)uVar7] = 0xff;
        }
        for (write_ptr_1._4_4_ = 0.0; (uint)write_ptr_1._4_4_ < (uint)fVar5;
            write_ptr_1._4_4_ = (float)((int)write_ptr_1._4_4_ + 1)) {
          puVar1[(ulong)(uint)write_ptr_1._4_4_ + (ulong)line_width + (ulong)uVar4 + (ulong)uVar7] =
               '\0';
        }
      }
      ImVec2::ImVec2(&uv1,(float)((this->X - 1) + uVar4),(float)(this->Y + line_width));
      IVar8 = operator*(&uv1,&atlas->TexUvScale);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff84,(float)(line_width + 1 + this->X + uVar4),
                     (float)(this->Y + 1 + line_width));
      local_74 = operator*((ImVec2 *)&stack0xffffffffffffff84,&atlas->TexUvScale);
      fStack_60 = IVar8.y;
      local_80 = (fStack_60 + local_74.y) * 0.5;
      local_64 = IVar8.x;
      ImVec4::ImVec4(&local_90,local_64,local_80,local_74.x,local_80);
      pIVar6 = atlas->TexUvLines + line_width;
      pIVar6->x = local_90.x;
      pIVar6->y = local_90.y;
      pIVar6->z = local_90.z;
      pIVar6->w = local_90.w;
    }
  }
  return;
}

Assistant:

static void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas* atlas)
{
    if (atlas->Flags & ImFontAtlasFlags_NoBakedLines)
        return;

    // This generates a triangular shape in the texture, with the various line widths stacked on top of each other to allow interpolation between them
    ImFontAtlasCustomRect* r = atlas->GetCustomRectByIndex(atlas->PackIdLines);
    IM_ASSERT(r->IsPacked());
    for (unsigned int n = 0; n < IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 1; n++) // +1 because of the zero-width row
    {
        // Each line consists of at least two empty pixels at the ends, with a line of solid pixels in the middle
        unsigned int y = n;
        unsigned int line_width = n;
        unsigned int pad_left = (r->Width - line_width) / 2;
        unsigned int pad_right = r->Width - (pad_left + line_width);

        // Write each slice
        IM_ASSERT(pad_left + line_width + pad_right == r->Width && y < r->Height); // Make sure we're inside the texture bounds before we start writing pixels
        if (atlas->TexPixelsAlpha8 != NULL)
        {
            unsigned char* write_ptr = &atlas->TexPixelsAlpha8[r->X + ((r->Y + y) * atlas->TexWidth)];
            for (unsigned int i = 0; i < pad_left; i++)
                *(write_ptr + i) = 0x00;

            for (unsigned int i = 0; i < line_width; i++)
                *(write_ptr + pad_left + i) = 0xFF;

            for (unsigned int i = 0; i < pad_right; i++)
                *(write_ptr + pad_left + line_width + i) = 0x00;
        }
        else
        {
            unsigned int* write_ptr = &atlas->TexPixelsRGBA32[r->X + ((r->Y + y) * atlas->TexWidth)];
            for (unsigned int i = 0; i < pad_left; i++)
                *(write_ptr + i) = IM_COL32_BLACK_TRANS;

            for (unsigned int i = 0; i < line_width; i++)
                *(write_ptr + pad_left + i) = IM_COL32_WHITE;

            for (unsigned int i = 0; i < pad_right; i++)
                *(write_ptr + pad_left + line_width + i) = IM_COL32_BLACK_TRANS;
        }

        // Calculate UVs for this line
        ImVec2 uv0 = ImVec2((float)(r->X + pad_left - 1), (float)(r->Y + y)) * atlas->TexUvScale;
        ImVec2 uv1 = ImVec2((float)(r->X + pad_left + line_width + 1), (float)(r->Y + y + 1)) * atlas->TexUvScale;
        float half_v = (uv0.y + uv1.y) * 0.5f; // Calculate a constant V in the middle of the row to avoid sampling artifacts
        atlas->TexUvLines[n] = ImVec4(uv0.x, half_v, uv1.x, half_v);
    }
}